

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleLightObject
          (OpenGEXImporter *this,DDLNode *node,aiScene *pScene)

{
  pointer *pppaVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  pointer pcVar3;
  int iVar4;
  aiLightSourceType aVar5;
  aiLight *paVar6;
  string *psVar7;
  Property *pPVar8;
  char *__s;
  aiLight *light;
  string typeStr;
  string objName;
  allocator<char> local_79;
  aiLight *local_78;
  string local_70;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  paVar6 = (aiLight *)operator_new(0x46c);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mType = aiLightSource_UNDEFINED;
  (paVar6->mPosition).x = 0.0;
  (paVar6->mPosition).y = 0.0;
  (paVar6->mPosition).z = 0.0;
  (paVar6->mDirection).x = 0.0;
  (paVar6->mDirection).y = 0.0;
  *(undefined8 *)&(paVar6->mDirection).z = 0;
  (paVar6->mUp).x = 0.0;
  (paVar6->mUp).y = 0.0;
  *(undefined8 *)&(paVar6->mUp).z = 0;
  paVar6->mAttenuationLinear = 1.0;
  paVar6->mAttenuationQuadratic = 0.0;
  (paVar6->mColorDiffuse).r = 0.0;
  (paVar6->mColorDiffuse).g = 0.0;
  (paVar6->mColorDiffuse).b = 0.0;
  (paVar6->mColorSpecular).r = 0.0;
  (paVar6->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar6->mColorSpecular).b = 0;
  (paVar6->mColorAmbient).g = 0.0;
  (paVar6->mColorAmbient).b = 0.0;
  paVar6->mAngleInnerCone = 6.2831855;
  paVar6->mAngleOuterCone = 6.2831855;
  (paVar6->mSize).x = 0.0;
  (paVar6->mSize).y = 0.0;
  __position._M_current =
       (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_78 = paVar6;
  if (__position._M_current ==
      (this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiLight*,std::allocator<aiLight*>>::_M_realloc_insert<aiLight*const&>
              ((vector<aiLight*,std::allocator<aiLight*>> *)&this->m_lightCache,__position,&local_78
              );
  }
  else {
    *__position._M_current = paVar6;
    pppaVar1 = &(this->m_lightCache).super__Vector_base<aiLight_*,_std::allocator<aiLight_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppaVar1 = *pppaVar1 + 1;
  }
  psVar7 = ODDLParser::DDLNode::getName_abi_cxx11_(node);
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + psVar7->_M_string_length);
  paVar6 = local_78;
  if (0xfffffffffffffc00 < local_48 - 0x400) {
    (local_78->mName).length = (ai_uint32)local_48;
    memcpy((local_78->mName).data,local_50,local_48);
    (paVar6->mName).data[local_48] = '\0';
  }
  this->m_currentLight = local_78;
  paVar2 = &local_70.field_2;
  local_70.field_2._M_allocated_capacity._0_4_ = 0x65707974;
  local_70._M_string_length = 4;
  local_70.field_2._M_allocated_capacity._4_4_ =
       local_70.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  pPVar8 = ODDLParser::DDLNode::findPropertyByName(node,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                             local_70.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((pPVar8 == (Property *)0x0) || (pPVar8->m_value == (Value *)0x0)) goto LAB_0042d47d;
  __s = ODDLParser::Value::getString(pPVar8->m_value);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_79);
  iVar4 = std::__cxx11::string::compare((char *)&local_70);
  if (iVar4 == 0) {
    aVar5 = aiLightSource_POINT;
LAB_0042d459:
    this->m_currentLight->mType = aVar5;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar4 == 0) {
      aVar5 = aiLightSource_SPOT;
      goto LAB_0042d459;
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar4 == 0) {
      aVar5 = aiLightSource_DIRECTIONAL;
      goto LAB_0042d459;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                             local_70.field_2._M_allocated_capacity._0_4_) + 1);
  }
LAB_0042d47d:
  handleNodes(this,node,pScene);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

void OpenGEXImporter::handleLightObject( ODDLParser::DDLNode *node, aiScene *pScene ) {
    aiLight *light( new aiLight );
    m_lightCache.push_back( light );
    std::string objName = node->getName();
    if ( !objName.empty() ) {
        light->mName.Set( objName );
    }
    m_currentLight = light;

    Property *prop( node->findPropertyByName( "type" ) );
    if ( nullptr != prop ) {
        if ( nullptr != prop->m_value ) {
            std::string typeStr( prop->m_value->getString() );
            if ( "point" == typeStr ) {
                m_currentLight->mType = aiLightSource_POINT;
            } else if ( "spot" == typeStr ) {
                m_currentLight->mType = aiLightSource_SPOT;
            } else if ( "infinite" == typeStr ) {
                m_currentLight->mType = aiLightSource_DIRECTIONAL;
            }
        }
    }

    // parameters will be parsed normally in the tree, so just go for it
    handleNodes( node, pScene );
}